

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_sysret_x86_64(CPUX86State *env,int dflag)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int exception_index;
  uintptr_t unaff_retaddr;
  
  if ((env->efer & 1) == 0) {
    exception_index = 6;
  }
  else {
    if (((env->cr[0] & 1) != 0) && (uVar1 = env->hflags, (uVar1 & 3) == 0)) {
      uVar2 = (uint)*(ushort *)((long)&env->star + 6);
      if ((uVar1 >> 0xe & 1) == 0) {
        uVar3 = env->eflags;
        env->eflags = uVar3 | 0x200;
        uVar2 = uVar2 | 3;
        env->segs[1].selector = uVar2;
        env->segs[1].base = 0;
        env->segs[1].limit = 0xffffffff;
        env->segs[1].flags = 0xc0fb00;
        env->hflags = uVar1 & 0xffff3fec | 0x10;
        uVar4 = env->segs[2].flags >> 0x11 & 0x20;
        if (((uint)uVar3 >> 0x11 & 1) == 0) {
          uVar4 = uVar4 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                env->segs[2].base != 0) << 6;
        }
        else {
          uVar4 = uVar4 | 0x40;
        }
        env->eip = (ulong)(uint)env->regs[1];
        env->segs[2].selector = uVar2 + 8;
        env->segs[2].base = 0;
        env->segs[2].limit = 0xffffffff;
        env->segs[2].flags = 0xc0f300;
        env->hflags = uVar1 & 0xffff3f8c | 0x10 | uVar4 | 3;
      }
      else {
        uVar3 = env->regs[0xb];
        uVar4 = (uint)uVar3;
        env->cc_src = (ulong)(uVar4 & 0x8d5);
        env->cc_op = 1;
        env->df = 1 - ((uint)(uVar3 >> 9) & 2);
        env->eflags = (env->eflags & 0xffffffffffd88cfd) + (ulong)(uVar4 & 0x277300) + 2;
        uVar2 = uVar2 | 3;
        if (dflag == 2) {
          env->segs[1].selector = uVar2 + 0x10;
          env->segs[1].base = 0;
          env->segs[1].limit = 0xffffffff;
          env->segs[1].flags = 0xa0fb00;
          env->hflags = (uVar1 & 0xffff7f8c) + (env->segs[2].flags >> 0x11 & 0x20) + 0x8010;
          uVar3 = env->regs[1];
        }
        else {
          env->segs[1].selector = uVar2;
          env->segs[1].base = 0;
          env->segs[1].limit = 0xffffffff;
          env->segs[1].flags = 0xc0fb00;
          env->hflags = uVar1 & 0xffff7fec | 0x10;
          uVar5 = env->segs[2].flags >> 0x11 & 0x20;
          if ((uVar4 >> 0x11 & 1) == 0) {
            uVar5 = uVar5 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                  env->segs[2].base != 0) << 6;
          }
          else {
            uVar5 = uVar5 | 0x40;
          }
          env->hflags = uVar1 & 0xffff7f8c | 0x10 | uVar5;
          uVar3 = (ulong)(uint)env->regs[1];
        }
        env->eip = uVar3;
        env->segs[2].selector = uVar2 + 8;
        env->segs[2].base = 0;
        env->segs[2].limit = 0xffffffff;
        env->segs[2].flags = 0xc0f300;
        *(byte *)&env->hflags = (byte)env->hflags | 3;
      }
      cpu_sync_bndcs_hflags_x86_64(env);
      uVar1 = env->hflags;
      uVar2 = env->segs[2].flags >> 0x11 & 0x20;
      if (-1 < (short)uVar1) {
        if ((((env->cr[0] & 1) == 0) || ((uVar1 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0)) {
          uVar2 = uVar2 | 0x40;
        }
        else {
          uVar2 = uVar2 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                env->segs[2].base != 0) << 6;
        }
      }
      env->hflags = uVar1 & 0xffffff9f | uVar2;
      return;
    }
    exception_index = 0xd;
  }
  raise_exception_err_ra_x86_64(env,exception_index,0,unaff_retaddr);
}

Assistant:

void helper_sysret(CPUX86State *env, int dflag)
{
    int cpl, selector;

    if (!(env->efer & MSR_EFER_SCE)) {
        raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (!(env->cr[0] & CR0_PE_MASK) || cpl != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    selector = (env->star >> 48) & 0xffff;
    if (env->hflags & HF_LMA_MASK) {
        cpu_load_eflags(env, (uint32_t)(env->regs[11]), TF_MASK | AC_MASK
                        | ID_MASK | IF_MASK | IOPL_MASK | VM_MASK | RF_MASK |
                        NT_MASK);
        if (dflag == 2) {
            cpu_x86_load_seg_cache(env, R_CS, (selector + 16) | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK |
                                   DESC_L_MASK);
            env->eip = env->regs[R_ECX];
        } else {
            cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                                   0, 0xffffffff,
                                   DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                                   DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                                   DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
            env->eip = (uint32_t)env->regs[R_ECX];
        }
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    } else {
        env->eflags |= IF_MASK;
        cpu_x86_load_seg_cache(env, R_CS, selector | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_CS_MASK | DESC_R_MASK | DESC_A_MASK);
        env->eip = (uint32_t)env->regs[R_ECX];
        cpu_x86_load_seg_cache(env, R_SS, (selector + 8) | 3,
                               0, 0xffffffff,
                               DESC_G_MASK | DESC_B_MASK | DESC_P_MASK |
                               DESC_S_MASK | (3 << DESC_DPL_SHIFT) |
                               DESC_W_MASK | DESC_A_MASK);
    }
}